

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDebug.cpp
# Opt level: O3

HighsDebugStatus __thiscall
HEkk::debugNonbasicFreeColumnSet(HEkk *this,HighsInt num_free_col,HSet *nonbasic_free_col_set)

{
  double dVar1;
  int iVar2;
  HighsOptions *pHVar3;
  pointer pdVar4;
  bool bVar5;
  HighsDebugStatus HVar6;
  ulong uVar7;
  long lVar8;
  char *format;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  
  pHVar3 = this->options_;
  if ((pHVar3->super_HighsOptionsStruct).highs_debug_level < 1) {
    return kNotChecked;
  }
  iVar2 = (this->lp_).num_row_;
  uVar9 = iVar2 + (this->lp_).num_col_;
  if (uVar9 == 0 || SCARRY4(iVar2,(this->lp_).num_col_) != (int)uVar9 < 0) {
    uVar7 = 0;
  }
  else {
    uVar10 = 0;
    uVar7 = 0;
    do {
      if (((this->info_).workLower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar10] <= -INFINITY) &&
         (INFINITY <=
          (this->info_).workUpper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar10])) {
        uVar7 = (ulong)((int)uVar7 + 1);
      }
      uVar10 = uVar10 + 1;
    } while (uVar9 != uVar10);
  }
  if ((int)uVar7 == num_free_col) {
    if (num_free_col == 0) {
      return kOk;
    }
    bVar5 = HSet::debug(nonbasic_free_col_set);
    if (!bVar5) {
      highsLogDev(&(pHVar3->super_HighsOptionsStruct).log_options,kInfo,
                  "NonbasicFreeColumnData: HSet error\n");
      return kLogicalError;
    }
    if ((int)uVar9 < 1) {
      HVar6 = kOk;
      if (nonbasic_free_col_set->count_ == 0) {
        return kOk;
      }
    }
    else {
      uVar10 = 0;
      uVar7 = 0;
      do {
        if (((this->basis_).nonbasicFlag_.
             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
             super__Vector_impl_data._M_start[uVar10] == '\x01') &&
           ((this->info_).workLower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar10] <= -INFINITY)) {
          uVar7 = (ulong)(((int)uVar7 + 1) -
                         (uint)((this->info_).workUpper_.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar10] < INFINITY));
        }
        HVar6 = (HighsDebugStatus)uVar7;
        uVar10 = uVar10 + 1;
      } while (uVar9 != uVar10);
      if (HVar6 == nonbasic_free_col_set->count_) {
        if (HVar6 < kSmallError) {
          return kOk;
        }
        pdVar4 = (this->info_).workUpper_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar10 = 0;
        while( true ) {
          lVar8 = (long)(nonbasic_free_col_set->entry_).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar10];
          uVar9 = (uint)(this->basis_).nonbasicFlag_.
                        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar8];
          uVar11 = (ulong)uVar9;
          dVar1 = (this->info_).workLower_.super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar8];
          if (((uVar9 != 1) || (uVar11 = 1, -INFINITY < dVar1)) || (pdVar4[lVar8] < INFINITY))
          break;
          uVar10 = uVar10 + 1;
          if (uVar7 == uVar10) {
            return kOk;
          }
        }
        highsLogDev(&(pHVar3->super_HighsOptionsStruct).log_options,kInfo,
                    "NonbasicFreeColumnData: Variable %d in nonbasic free set has nonbasicFlag = %d and bounds [%g, %g]\n"
                    ,dVar1,pdVar4[lVar8],lVar8,uVar11);
        return kLogicalError;
      }
    }
    format = "NonbasicFreeColumnData: Set should have %d entries, not %d\n";
    uVar7 = (ulong)(uint)HVar6;
  }
  else {
    format = "NonbasicFreeColumnData: Number of free columns should be %d, not %d\n";
  }
  highsLogDev(&(pHVar3->super_HighsOptionsStruct).log_options,kInfo,format,uVar7);
  return kLogicalError;
}

Assistant:

HighsDebugStatus HEkk::debugNonbasicFreeColumnSet(
    const HighsInt num_free_col, const HSet nonbasic_free_col_set) const {
  const HighsOptions& options = *(this->options_);
  if (options.highs_debug_level < kHighsDebugLevelCheap)
    return HighsDebugStatus::kNotChecked;
  const HighsLp& lp = this->lp_;
  const HighsSimplexInfo& info = this->info_;
  const SimplexBasis& basis = this->basis_;
  HighsInt num_tot = lp.num_col_ + lp.num_row_;

  // Check the number of free columns
  HighsInt check_num_free_col = 0;
  for (HighsInt iVar = 0; iVar < num_tot; iVar++) {
    if (info.workLower_[iVar] <= -kHighsInf &&
        info.workUpper_[iVar] >= kHighsInf)
      check_num_free_col++;
  }
  if (check_num_free_col != num_free_col) {
    highsLogDev(options.log_options, HighsLogType::kInfo,
                "NonbasicFreeColumnData: Number of free columns should be "
                "%" HIGHSINT_FORMAT ", not %" HIGHSINT_FORMAT "\n",
                check_num_free_col, num_free_col);
    return HighsDebugStatus::kLogicalError;
  }
  if (!num_free_col) return HighsDebugStatus::kOk;
  // Debug HSet nonbasic_free_col
  bool nonbasic_free_col_ok = nonbasic_free_col_set.debug();
  if (!nonbasic_free_col_ok) {
    highsLogDev(options.log_options, HighsLogType::kInfo,
                "NonbasicFreeColumnData: HSet error\n");
    return HighsDebugStatus::kLogicalError;
  }

  // Check that we have the right number of nonbasic free columns
  const HighsInt& num_nonbasic_free_col = nonbasic_free_col_set.count();
  HighsInt check_num_nonbasic_free_col = 0;
  for (HighsInt iVar = 0; iVar < num_tot; iVar++) {
    bool nonbasic_free = basis.nonbasicFlag_[iVar] == kNonbasicFlagTrue &&
                         info.workLower_[iVar] <= -kHighsInf &&
                         info.workUpper_[iVar] >= kHighsInf;
    if (nonbasic_free) check_num_nonbasic_free_col++;
  }
  if (check_num_nonbasic_free_col != num_nonbasic_free_col) {
    highsLogDev(options.log_options, HighsLogType::kInfo,
                "NonbasicFreeColumnData: Set should have %" HIGHSINT_FORMAT
                " entries, not %" HIGHSINT_FORMAT "\n",
                check_num_nonbasic_free_col, num_nonbasic_free_col);
    return HighsDebugStatus::kLogicalError;
  }
  // Check that all in the set are nonbasic free columns
  const vector<HighsInt>& nonbasic_free_col_set_entry =
      nonbasic_free_col_set.entry();
  for (HighsInt ix = 0; ix < num_nonbasic_free_col; ix++) {
    HighsInt iVar = nonbasic_free_col_set_entry[ix];
    bool nonbasic_free = basis.nonbasicFlag_[iVar] == kNonbasicFlagTrue &&
                         info.workLower_[iVar] <= -kHighsInf &&
                         info.workUpper_[iVar] >= kHighsInf;
    if (!nonbasic_free) {
      highsLogDev(options.log_options, HighsLogType::kInfo,
                  "NonbasicFreeColumnData: Variable %" HIGHSINT_FORMAT
                  " in nonbasic free "
                  "set has nonbasicFlag = %" HIGHSINT_FORMAT
                  " and bounds [%g, %g]\n",
                  iVar, basis.nonbasicFlag_[iVar], info.workLower_[iVar],
                  info.workUpper_[iVar]);
      return HighsDebugStatus::kLogicalError;
    }
  }
  return HighsDebugStatus::kOk;
}